

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O1

compile_errcode __thiscall ArgumentList::Parse(ArgumentList *this)

{
  bool bVar1;
  LogTools *log_tools_ptr;
  compile_errcode in_EAX;
  SymbolName SVar2;
  compile_errcode cVar3;
  undefined4 uVar4;
  string local_50;
  
  uVar4 = 0;
  do {
    SVar2 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    switch(uVar4) {
    case 0:
      uVar4 = 0;
      bVar1 = false;
      cVar3 = 0;
      if (SVar2 != R_CIRCLE_BRACKET_SYM) {
        uVar4 = 1;
        if ((SVar2 & ~SWITCH_SYM) != INT_SYM) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"expected a \')\' in argument list","");
          GrammaErrorLogs(log_tools_ptr,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          cVar3 = -1;
          uVar4 = 0;
          goto LAB_0012deea;
        }
        break;
      }
      goto LAB_0012deec;
    case 1:
      uVar4 = 2;
      if (SVar2 != IDENTIFIER_SYM) {
        cVar3 = -1;
        uVar4 = 1;
LAB_0012deea:
        bVar1 = false;
        goto LAB_0012deec;
      }
      break;
    case 2:
      uVar4 = 3;
      if (SVar2 != COMMA_SYM) {
        cVar3 = 0;
        uVar4 = 2;
        goto LAB_0012deea;
      }
      break;
    case 3:
      uVar4 = 1;
      if ((SVar2 & ~SWITCH_SYM) != INT_SYM) {
        cVar3 = -1;
        uVar4 = 3;
        goto LAB_0012deea;
      }
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
    bVar1 = true;
    cVar3 = in_EAX;
LAB_0012deec:
    in_EAX = cVar3;
    if (!bVar1) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

compile_errcode ArgumentList::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if (IsValidVariableType(name)) {
                    state = 1;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')' in argument list");
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == COMMA_SYM) {
                    state = 3;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 3: {
                if (IsValidVariableType(name)) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        handle_symbol_queue->NextSymbol();
    }
}